

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O3

void Wlc_BlastReduceMatrix(Gia_Man_t *pNew,Vec_Wec_t *vProds,Vec_Wec_t *vLevels,Vec_Int_t *vRes)

{
  uint uVar1;
  int b;
  int iVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  ulong uVar6;
  Vec_Int_t *pVVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  Vec_Int_t *pVVar13;
  long lVar14;
  int NodeC;
  int NodeS;
  int local_68;
  int local_64;
  ulong local_60;
  Gia_Man_t *local_58;
  Vec_Wec_t *local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  uVar9 = vProds->nSize;
  uVar12 = (ulong)uVar9;
  uVar1 = vLevels->nSize;
  local_58 = pNew;
  if (uVar9 != uVar1) {
    __assert_fail("nSize == Vec_WecSize(vLevels)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                  ,0x27d,
                  "void Wlc_BlastReduceMatrix(Gia_Man_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *)");
  }
  if (0 < (int)uVar9) {
    uVar10 = 0;
    uVar6 = (ulong)uVar9;
    local_60 = uVar12;
    local_50 = vProds;
    do {
      if ((long)(int)uVar6 <= (long)uVar10) goto LAB_00305eb0;
      iVar11 = vProds->pArray[uVar10].nSize;
      uVar12 = uVar10 + 1;
      if (2 < iVar11) {
        pVVar7 = vProds->pArray + uVar10;
        local_48 = uVar10 * 0x10;
        local_40 = uVar10;
        local_38 = uVar10 + 1;
        do {
          piVar4 = pVVar7->pArray;
          pVVar7->nSize = iVar11 - 1U;
          iVar5 = piVar4[iVar11 - 1U];
          pVVar7->nSize = iVar11 - 2U;
          b = piVar4[iVar11 - 2U];
          pVVar7->nSize = iVar11 - 3U;
          if ((long)vLevels->nSize <= (long)local_40) goto LAB_00305eb0;
          iVar2 = *(int *)((long)&vLevels->pArray->nSize + local_48);
          if (iVar2 < 1) {
LAB_00305ecf:
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x3b1,"int Vec_IntPop(Vec_Int_t *)");
          }
          iVar11 = piVar4[iVar11 - 3U];
          pVVar13 = (Vec_Int_t *)((long)&vLevels->pArray->nCap + local_48);
          piVar4 = pVVar13->pArray;
          uVar9 = iVar2 - 1;
          pVVar13->nSize = uVar9;
          if (uVar9 == 0) goto LAB_00305ecf;
          iVar3 = piVar4[uVar9];
          uVar9 = iVar2 - 2;
          pVVar13->nSize = uVar9;
          if (uVar9 == 0) goto LAB_00305ecf;
          iVar8 = piVar4[uVar9];
          pVVar13->nSize = iVar2 - 3U;
          iVar2 = piVar4[iVar2 - 3U];
          Wlc_BlastFullAdder(local_58,iVar5,b,iVar11,&local_68,&local_64);
          if (iVar8 < iVar3) {
            iVar8 = iVar3;
          }
          if (iVar8 <= iVar2) {
            iVar8 = iVar2;
          }
          Wlc_IntInsert(pVVar7,pVVar13,local_64,iVar8 + 2);
          uVar12 = local_38;
          vProds = local_50;
          if (((long)local_50->nSize <= (long)local_38) || ((long)vLevels->nSize <= (long)local_38))
          goto LAB_00305eb0;
          Wlc_IntInsert(local_50->pArray + local_38,vLevels->pArray + local_38,local_68,iVar8 + 1);
          uVar6 = (ulong)vProds->nSize;
          if ((long)uVar6 <= (long)local_40) goto LAB_00305eb0;
          iVar11 = *(int *)((long)&vProds->pArray->nSize + local_48);
          pVVar7 = (Vec_Int_t *)((long)&vProds->pArray->nCap + local_48);
        } while (2 < iVar11);
      }
      uVar10 = uVar12;
      uVar12 = local_60;
    } while (uVar10 != local_60);
    iVar11 = (int)local_60;
    if (0 < iVar11) {
      uVar6 = 0;
      do {
        if ((long)vProds->nSize <= (long)uVar6) goto LAB_00305eb0;
        iVar5 = vProds->pArray[uVar6].nSize;
        if (iVar5 < 2) {
          pVVar7 = vProds->pArray + uVar6;
          do {
            Vec_IntPush(pVVar7,0);
            iVar5 = pVVar7->nSize;
          } while (iVar5 < 2);
        }
        if (iVar5 != 2) {
          __assert_fail("Vec_IntSize(vProd) == 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                        ,0x2a3,
                        "void Wlc_BlastReduceMatrix(Gia_Man_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *)"
                       );
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar12);
      if (vLevels->nSize < 1) goto LAB_00305eb0;
      pVVar7 = vLevels->pArray;
      vRes->nSize = 0;
      pVVar7->nSize = 0;
      if (0 < iVar11) {
        lVar14 = 8;
        uVar6 = 0;
        do {
          if ((long)vProds->nSize <= (long)uVar6) goto LAB_00305eb0;
          pVVar13 = vProds->pArray;
          if ((*(int *)((long)pVVar13 + lVar14 + -4) < 1) ||
             (Vec_IntPush(vRes,**(int **)((long)&pVVar13->nCap + lVar14)),
             *(int *)((long)pVVar13 + lVar14 + -4) < 2)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          Vec_IntPush(pVVar7,*(int *)(*(long *)((long)&pVVar13->nCap + lVar14) + 4));
          uVar6 = uVar6 + 1;
          lVar14 = lVar14 + 0x10;
          uVar12 = local_60;
        } while (local_60 != uVar6);
      }
      goto LAB_00305e86;
    }
    uVar1 = vLevels->nSize;
  }
  if ((int)uVar1 < 1) {
LAB_00305eb0:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                  ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  pVVar7 = vLevels->pArray;
  vRes->nSize = 0;
  pVVar7->nSize = 0;
LAB_00305e86:
  Wlc_BlastAdder(local_58,vRes->pArray,pVVar7->pArray,(int)uVar12);
  return;
}

Assistant:

void Wlc_BlastReduceMatrix( Gia_Man_t * pNew, Vec_Wec_t * vProds, Vec_Wec_t * vLevels, Vec_Int_t * vRes )
{
    Vec_Int_t * vLevel, * vProd;
    int i, NodeS, NodeC, LevelS, LevelC, Node1, Node2, Node3, Level1, Level2, Level3;
    int nSize = Vec_WecSize(vProds);
    assert( nSize == Vec_WecSize(vLevels) );
    for ( i = 0; i < nSize; i++ )
    {
        while ( 1 )
        {
            vProd  = Vec_WecEntry( vProds, i );
            if ( Vec_IntSize(vProd) < 3 )
                break;

            Node1  = Vec_IntPop( vProd );
            Node2  = Vec_IntPop( vProd );
            Node3  = Vec_IntPop( vProd );

            vLevel = Vec_WecEntry( vLevels, i );

            Level1 = Vec_IntPop( vLevel );
            Level2 = Vec_IntPop( vLevel );
            Level3 = Vec_IntPop( vLevel );

            Wlc_BlastFullAdder( pNew, Node1, Node2, Node3, &NodeC, &NodeS );
            LevelS = Abc_MaxInt( Abc_MaxInt(Level1, Level2), Level3 ) + 2;
            LevelC = LevelS - 1;

            Wlc_IntInsert( vProd, vLevel, NodeS, LevelS );

            vProd  = Vec_WecEntry( vProds, i+1 );
            vLevel = Vec_WecEntry( vLevels, i+1 );

            Wlc_IntInsert( vProd, vLevel, NodeC, LevelC );
        }
    }

    // make all ranks have two products
    for ( i = 0; i < nSize; i++ )
    {
        vProd  = Vec_WecEntry( vProds, i );
        while ( Vec_IntSize(vProd) < 2 )
            Vec_IntPush( vProd, 0 );
        assert( Vec_IntSize(vProd) == 2 );
    }

    vLevel = Vec_WecEntry( vLevels, 0 );
    Vec_IntClear( vRes );
    Vec_IntClear( vLevel );
    for ( i = 0; i < nSize; i++ )
    {
        vProd  = Vec_WecEntry( vProds, i );
        Vec_IntPush( vRes,   Vec_IntEntry(vProd, 0) );
        Vec_IntPush( vLevel, Vec_IntEntry(vProd, 1) );
    }
    Wlc_BlastAdder( pNew, Vec_IntArray(vRes), Vec_IntArray(vLevel), nSize );
}